

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangular.cpp
# Opt level: O0

void __thiscall options::options(options *this,uint argc,char **argv)

{
  int iVar1;
  string *psVar2;
  long in_RDX;
  uint in_ESI;
  int *in_RDI;
  uint i;
  uint local_34;
  allocator local_2e;
  allocator local_2d [20];
  allocator local_19;
  long local_18;
  uint local_c;
  
  *in_RDI = 0xf;
  local_18 = in_RDX;
  local_c = in_ESI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 2),"1",&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 10),"1",local_2d);
  std::allocator<char>::~allocator((allocator<char> *)local_2d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x12),"1",&local_2e);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e);
  std::__cxx11::string::string((string *)(in_RDI + 0x1a));
  std::__cxx11::string::string((string *)(in_RDI + 0x22));
  std::__cxx11::string::string((string *)(in_RDI + 0x2a));
  *(undefined1 *)(in_RDI + 0x32) = 1;
  if (local_c == 1) {
    *(undefined1 *)(in_RDI + 0x32) = 0;
  }
  else {
    for (local_34 = 1; local_34 < local_c; local_34 = local_34 + 2) {
      if (**(char **)(local_18 + (ulong)local_34 * 8) != '-') {
        switch(~local_34 + local_c) {
        case 0:
          psVar2 = (string *)std::__cxx11::string::operator=((string *)(in_RDI + 0x12),"1");
          psVar2 = (string *)std::__cxx11::string::operator=((string *)(in_RDI + 10),psVar2);
          std::__cxx11::string::operator=((string *)(in_RDI + 2),psVar2);
          psVar2 = (string *)
                   std::__cxx11::string::operator=
                             ((string *)(in_RDI + 0x2a),*(char **)(local_18 + (ulong)local_34 * 8));
          psVar2 = (string *)std::__cxx11::string::operator=((string *)(in_RDI + 0x22),psVar2);
          std::__cxx11::string::operator=((string *)(in_RDI + 0x1a),psVar2);
          return;
        case 1:
          psVar2 = (string *)
                   std::__cxx11::string::operator=
                             ((string *)(in_RDI + 0x12),*(char **)(local_18 + (ulong)local_34 * 8));
          psVar2 = (string *)std::__cxx11::string::operator=((string *)(in_RDI + 10),psVar2);
          std::__cxx11::string::operator=((string *)(in_RDI + 2),psVar2);
          psVar2 = (string *)
                   std::__cxx11::string::operator=
                             ((string *)(in_RDI + 0x2a),
                              *(char **)(local_18 + (ulong)(local_34 + 1) * 8));
          psVar2 = (string *)std::__cxx11::string::operator=((string *)(in_RDI + 0x22),psVar2);
          std::__cxx11::string::operator=((string *)(in_RDI + 0x1a),psVar2);
          return;
        default:
          *(undefined1 *)(in_RDI + 0x32) = 0;
          return;
        case 3:
          std::__cxx11::string::operator=
                    ((string *)(in_RDI + 2),*(char **)(local_18 + (ulong)local_34 * 8));
          std::__cxx11::string::operator=
                    ((string *)(in_RDI + 10),*(char **)(local_18 + (ulong)(local_34 + 1) * 8));
          std::__cxx11::string::operator=
                    ((string *)(in_RDI + 0x12),*(char **)(local_18 + (ulong)(local_34 + 2) * 8));
          psVar2 = (string *)
                   std::__cxx11::string::operator=
                             ((string *)(in_RDI + 0x2a),
                              *(char **)(local_18 + (ulong)(local_34 + 3) * 8));
          psVar2 = (string *)std::__cxx11::string::operator=((string *)(in_RDI + 0x22),psVar2);
          std::__cxx11::string::operator=((string *)(in_RDI + 0x1a),psVar2);
          return;
        case 5:
          std::__cxx11::string::operator=
                    ((string *)(in_RDI + 2),*(char **)(local_18 + (ulong)local_34 * 8));
          std::__cxx11::string::operator=
                    ((string *)(in_RDI + 10),*(char **)(local_18 + (ulong)(local_34 + 1) * 8));
          std::__cxx11::string::operator=
                    ((string *)(in_RDI + 0x12),*(char **)(local_18 + (ulong)(local_34 + 2) * 8));
          std::__cxx11::string::operator=
                    ((string *)(in_RDI + 0x1a),*(char **)(local_18 + (ulong)(local_34 + 3) * 8));
          std::__cxx11::string::operator=
                    ((string *)(in_RDI + 0x22),*(char **)(local_18 + (ulong)(local_34 + 4) * 8));
          std::__cxx11::string::operator=
                    ((string *)(in_RDI + 0x2a),*(char **)(local_18 + (ulong)(local_34 + 5) * 8));
          return;
        }
      }
      if (*(char *)(*(long *)(local_18 + (ulong)local_34 * 8) + 1) != 'p') {
        *(undefined1 *)(in_RDI + 0x32) = 0;
        return;
      }
      if (local_34 + 1 == local_c) {
        *(undefined1 *)(in_RDI + 0x32) = 0;
        return;
      }
      iVar1 = atoi(*(char **)(local_18 + (ulong)(local_34 + 1) * 8));
      *in_RDI = iVar1;
    }
  }
  return;
}

Assistant:

options(unsigned int argc, char *argv[])
      : prec(15), Ja("1"), Jb("1"), Jc("1"), valid(true) {
    if (argc == 1) {
      valid = false;
      return;
    }
    for (unsigned i = 1; i < argc; ++i) {
      switch (argv[i][0]) {
        case '-':
          switch (argv[i][1]) {
            case 'p':
              if (++i == argc) {
                valid = false;
                return;
              }
              prec = std::atoi(argv[i]);
              break;
            default:
              valid = false;
              return;
          }
          break;
        default:
          switch (argc - i) {
            case 1:
              Ja = Jb = Jc = "1";
              Tmin = Tmax = dT = argv[i];
              return;
            case 2:
              Ja = Jb = Jc = argv[i];
              Tmin = Tmax = dT = argv[i + 1];
              return;
            case 4:
              Ja = argv[i];
              Jb = argv[i + 1];
              Jc = argv[i + 2];
              Tmin = Tmax = dT = argv[i + 3];
              return;
            case 6:
              Ja = argv[i];
              Jb = argv[i + 1];
              Jc = argv[i + 2];
              Tmin = argv[i + 3];
              Tmax = argv[i + 4];
              dT = argv[i + 5];
              return;
            default:
              valid = false;
              return;
          }
      }
    }
  }